

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::AVxFirstPassEncoderThreadTest::PreEncodeFrameHook
          (AVxFirstPassEncoderThreadTest *this)

{
  Encoder *in_RDX;
  VideoSource *in_RSI;
  
  anon_unknown.dwarf_7c1c5b::AVxFirstPassEncoderThreadTest::PreEncodeFrameHook
            ((AVxFirstPassEncoderThreadTest *)(this + -0x18),in_RSI,in_RDX);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource * /*video*/,
                          ::libaom_test::Encoder *encoder) override {
    if (!encoder_initialized_) {
      // Encode in 2-pass mode.
      SetTileSize(encoder);
      encoder->Control(AV1E_SET_ROW_MT, row_mt_);
      encoder->Control(AOME_SET_CPUUSED, set_cpu_used_);
      encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
      encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
      encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
      encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 0);

      encoder_initialized_ = true;
    }
  }